

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip_list.c
# Opt level: O2

ion_sl_level_t sl_gen_level(ion_skiplist_t *skiplist)

{
  int iVar1;
  int iVar2;
  
  iVar1 = 0;
  do {
    iVar2 = iVar1;
    iVar1 = rand();
    if ((int)(0x7fffffff / (long)skiplist->pden) * skiplist->pnum <= iVar1) {
      return iVar2;
    }
    iVar1 = iVar2 + 1;
  } while (iVar2 + 1 < skiplist->maxheight);
  return iVar2;
}

Assistant:

ion_sl_level_t
sl_gen_level(
	ion_skiplist_t *skiplist
) {
	ion_sl_level_t level = 1;

	while ((rand() < skiplist->pnum * (RAND_MAX / skiplist->pden)) && level < skiplist->maxheight) {
		level++;
	}

	return level - 1;
}